

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::inputdialog(uint argc)

{
  int iVar1;
  vm_val_t *pvVar2;
  size_t sVar3;
  undefined1 *puVar4;
  int evt;
  char rscbuf [128];
  int resid;
  int id;
  size_t copy_len;
  char *p;
  vm_val_t *lst;
  vm_val_t *valp;
  int i;
  char numbuf [32];
  int resp;
  int cancel_resp;
  int default_resp;
  size_t dstrem;
  char *dst;
  int btn_cnt;
  int std_btns;
  int lst_cnt;
  char *labels [10];
  vm_val_t label_val [10];
  char label_buf [256];
  char prompt [256];
  int icon_id;
  vm_val_t *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffbbc;
  int in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  vm_val_t *in_stack_fffffffffffffbc8;
  int evt_00;
  CVmConsoleMain *pCVar6;
  CVmConsole *in_stack_fffffffffffffbd0;
  CVmConsole *this;
  char *in_stack_fffffffffffffbd8;
  int *in_stack_fffffffffffffbe0;
  CVmConsole *in_stack_fffffffffffffbe8;
  unsigned_long *in_stack_fffffffffffffc00;
  char local_3f8 [128];
  int local_378;
  int local_374;
  undefined1 *local_370;
  char *local_368;
  vm_val_t *local_360;
  int *local_358;
  int local_34c;
  CVmConsole local_348;
  int local_304;
  int local_300;
  uint local_2fc;
  long local_2f8;
  int in_stack_fffffffffffffd14;
  char **in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd24;
  char *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd34;
  CVmConsole *in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd60;
  vm_globalvar_t local_208 [16];
  int local_8;
  
  CVmBif::check_argc(0,0x3028ef);
  local_8 = CVmBif::pop_int_val();
  CVmBif::pop_str_val_ui
            ((char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  local_304 = 0;
  pvVar2 = CVmStack::get(0);
  if (pvVar2->typ == VM_INT) {
    local_300 = CVmBif::pop_int_val();
LAB_00302d08:
    pvVar2 = CVmStack::get(0);
    if (pvVar2->typ == VM_NIL) {
      CVmStack::discard();
      local_348.command_fp_._4_4_ = 0;
    }
    else {
      local_348.command_fp_._4_4_ = CVmBif::pop_int_val();
    }
    pvVar2 = CVmStack::get(0);
    if (pvVar2->typ == VM_NIL) {
      CVmStack::discard();
      local_348.command_fp_._0_4_ = 0;
    }
    else {
      local_348.command_fp_._0_4_ = CVmBif::pop_int_val();
    }
    iVar1 = CVmConsole::read_event_script
                      (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8
                       ,(size_t)in_stack_fffffffffffffbd0,(int *)in_stack_fffffffffffffbc8,
                       in_stack_fffffffffffffbc4,in_stack_fffffffffffffc00);
    evt_00 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
    if (iVar1 == 0) {
      if (G_net_config_X == (TadsNetConfig *)0x0) {
        (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[3])(G_console_X,1);
        uVar5 = 0;
        local_348.script_sp_._4_4_ =
             CVmConsole::input_dialog
                       (in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                        in_stack_fffffffffffffd28,in_stack_fffffffffffffd24,
                        in_stack_fffffffffffffd18,in_stack_fffffffffffffd14,
                        in_stack_fffffffffffffd50,in_stack_fffffffffffffd58,
                        in_stack_fffffffffffffd60);
        sprintf((char *)&local_348,"%d",(ulong)local_348.script_sp_._4_4_);
        this = &local_348;
        pCVar6 = G_console_X;
        strlen((char *)&local_348);
        CVmConsole::log_event
                  (this,(int)((ulong)pCVar6 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   CONCAT44(in_stack_fffffffffffffbbc,uVar5),in_stack_fffffffffffffbb4);
      }
      else {
        local_348.script_sp_._4_4_ = 0;
      }
    }
    else {
      local_348.script_sp_._4_4_ = atoi((char *)&local_348);
      strlen((char *)&local_348);
      CVmConsole::log_event
                (in_stack_fffffffffffffbd0,evt_00,
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 in_stack_fffffffffffffbb4);
    }
    CVmBif::retval_int(0x302efb);
    return;
  }
  CVmStack::get(0);
  iVar1 = vm_val_t::is_listlike
                    ((vm_val_t *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  if (iVar1 != 0) {
    CVmStack::get(0);
    local_2fc = vm_val_t::ll_length((vm_val_t *)
                                    CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    if (-1 < (int)local_2fc) {
      local_300 = 0;
      local_360 = CVmStack::get(0);
      if (10 < local_2fc) {
        local_2fc = 10;
      }
      local_358 = (int *)&stack0xfffffffffffffd58;
      for (local_34c = 1; local_34c <= (int)local_2fc; local_34c = local_34c + 1) {
        vm_val_t::ll_index((vm_val_t *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                           in_stack_fffffffffffffbc4);
        local_358 = (int *)((long)local_358 + 0x10);
      }
      CVmStack::discard();
      local_348.command_glob_ = local_208;
      local_348.command_nf_ = (CVmNetFile *)0x100;
      local_358 = (int *)&stack0xfffffffffffffd58;
      for (local_34c = 0; local_34c < (int)local_2fc; local_34c = local_34c + 1) {
        local_368 = vm_val_t::get_as_string(in_stack_fffffffffffffba8);
        if (local_368 == (char *)0x0) {
          if (*local_358 == 7) {
            local_374 = local_358[2];
            switch(local_374) {
            case 1:
              local_378 = 1;
              break;
            case 2:
              local_378 = 2;
              break;
            case 3:
              local_378 = 3;
              break;
            case 4:
              local_378 = 4;
              break;
            default:
              local_378 = 0;
            }
            if ((local_378 != 0) &&
               (iVar1 = os_get_str_rsc(in_stack_fffffffffffffbc0,
                                       (char *)CONCAT44(in_stack_fffffffffffffbbc,
                                                        in_stack_fffffffffffffbb8),
                                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)
                                      ), iVar1 == 0)) {
              (&local_2f8)[local_304] = (long)local_348.command_glob_;
              in_stack_fffffffffffffbe8 = (CVmConsole *)G_cmap_from_ui_X;
              local_304 = local_304 + 1;
              sVar3 = strlen(local_3f8);
              (*((CCharmap *)&in_stack_fffffffffffffbe8->_vptr_CVmConsole)->_vptr_CCharmap[4])
                        (in_stack_fffffffffffffbe8,&local_348.command_glob_,&local_348.command_nf_,
                         local_3f8,sVar3);
              *(undefined1 *)&((local_348.command_glob_)->val).typ = 0;
              local_348.command_nf_ = (CVmNetFile *)((long)&local_348.command_nf_[-1].mime_type + 7)
              ;
              local_348.command_glob_ =
                   (vm_globalvar_t *)((long)&((local_348.command_glob_)->val).typ + 1);
            }
          }
        }
        else {
          local_370 = (undefined1 *)vmb_get_len((char *)0x302a91);
          if ((undefined1 *)((long)&local_348.command_nf_[-1].mime_type + 7U) < local_370) {
            local_370 = (undefined1 *)
                        utf8_ptr::s_trunc((char *)in_stack_fffffffffffffbc8,
                                          CONCAT44(in_stack_fffffffffffffbc4,
                                                   in_stack_fffffffffffffbc0));
          }
          memcpy(local_348.command_glob_,local_368 + 2,(size_t)local_370);
          puVar4 = local_370 + 1;
          local_370[(long)&(local_348.command_glob_)->val] = 0;
          (&local_2f8)[local_304] = (long)local_348.command_glob_;
          local_348.command_nf_ = (CVmNetFile *)((long)local_348.command_nf_ - (long)puVar4);
          local_370 = puVar4;
          local_348.command_glob_ = (vm_globalvar_t *)(puVar4 + (long)local_348.command_glob_);
          local_304 = local_304 + 1;
        }
        local_358 = local_358 + 4;
      }
      goto LAB_00302d08;
    }
  }
  err_throw(0);
}

Assistant:

void CVmBifTIO::inputdialog(VMG_ uint argc)
{
    int icon_id;
    char prompt[256];
    char label_buf[256];
    vm_val_t label_val[10];
    const char *labels[10];
    int lst_cnt;
    int std_btns;
    int btn_cnt;
    char *dst;
    size_t dstrem;
    int default_resp;
    int cancel_resp;
    int resp;
    char numbuf[32];
    
    /* check arguments */
    check_argc(vmg_ argc, 5);

    /* get the icon number */
    icon_id = pop_int_val(vmg0_);

    /* get the prompt string */
    pop_str_val_ui(vmg_ prompt, sizeof(prompt));

    /* there aren't any buttons yet */
    btn_cnt = 0;

    /* check for the button type */
    if (G_stk->get(0)->typ == VM_INT)
    {
        /* get the standard button set ID */
        std_btns = pop_int_val(vmg0_);
    }
    else if (G_stk->get(0)->is_listlike(vmg0_)
             && (lst_cnt = G_stk->get(0)->ll_length(vmg0_)) >= 0)
    {
        int i;
        vm_val_t *valp;
        
        /* we're not using any standard button set */
        std_btns = 0;

        /* 
         *   run through the list and get the button items into our array
         *   (we do this rather than traversing the list directly so that
         *   we don't have to worry about a constant list's data being
         *   paged out) 
         */
        vm_val_t *lst = G_stk->get(0);

		/* limit the number of elements to our private array size */
		if ((size_t)lst_cnt > sizeof(label_val)/sizeof(label_val[0]))
            lst_cnt = sizeof(label_val)/sizeof(label_val[0]);

        /* copy the list */
        for (i = 1, valp = label_val ; i <= lst_cnt ; ++i, ++valp)
            lst->ll_index(vmg_ valp, i);

        /* done with the list - discard it */
        G_stk->discard();

        /* set up to write into our label buffer */
        dst = label_buf;
        dstrem = sizeof(label_buf);

        /* now build our internal button list from the array elements */
        for (i = 0, valp = label_val ; i < lst_cnt ; ++i, ++valp)
        {
            const char *p;

            /* 
             *   We could have a number or a string in each element.  If
             *   the element is a number, it refers to a standard label.
             *   If it's a string, use the string directly. 
             */
            if ((p = valp->get_as_string(vmg0_)) != 0)
            {
                size_t copy_len;
                
                /* 
                 *   it's a string - make a copy in the label buffer,
                 *   making sure to leave space for null termination 
                 */
                copy_len = vmb_get_len(p);
                if (copy_len > dstrem - 1)
                    copy_len = utf8_ptr::s_trunc(p + VMB_LEN, dstrem - 1);
                memcpy(dst, p + VMB_LEN, copy_len);

                /* null-terminate the buffer */
                dst[copy_len++] = '\0';

                /* set this button to point to the converted text */
                labels[btn_cnt++] = dst;

                /* skip past this label */
                dst += copy_len;
                dstrem -= copy_len;
            }
            else if (valp->typ == VM_INT)
            {
                int id;
                int resid;
                char rscbuf[128];
                
                /* it's a standard system label ID - get the ID */
                id = (int)valp->val.intval;

                /* translate it to the appropriate string resource */
                switch(id)
                {
                case BIFINPDLG_LBL_OK:
                    resid = VMRESID_BTN_OK;
                    break;

                case BIFINPDLG_LBL_CANCEL:
                    resid = VMRESID_BTN_CANCEL;
                    break;

                case BIFINPDLG_LBL_YES:
                    resid = VMRESID_BTN_YES;
                    break;

                case BIFINPDLG_LBL_NO:
                    resid = VMRESID_BTN_NO;
                    break;

                default:
                    resid = 0;
                    break;
                }

                /* 
                 *   if we got a valid resource ID, load the resource;
                 *   otherwise, skip this button 
                 */
                if (resid != 0
                    && !os_get_str_rsc(resid, rscbuf, sizeof(rscbuf)))
                {
                    /* set this button to point to the converted text */
                    labels[btn_cnt++] = dst;

                    /* convert the resource text to UTF-8 */
                    G_cmap_from_ui->map(&dst, &dstrem,
                                        rscbuf, strlen(rscbuf));

                    /* null-terminate the converted text */
                    *dst++ = '\0';
                    --dstrem;
                }
            }
        }
    }
    else
    {
        /* invalid button type */
        err_throw(VMERR_BAD_TYPE_BIF);
    }